

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

TLVReader * __thiscall
ASDCP::MXF::TLVReader::ReadUi64(TLVReader *this,MDDEntry *Entry,ui64_t *value)

{
  bool bVar1;
  ui64_t *in_RCX;
  ui64_t *value_local;
  MDDEntry *Entry_local;
  TLVReader *this_local;
  
  if (in_RCX == (ui64_t *)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else {
    bVar1 = FindTL((TLVReader *)Entry,(MDDEntry *)value);
    if (bVar1) {
      bVar1 = Kumu::MemIOReader::ReadUi64BE((MemIOReader *)Entry,in_RCX);
      if (bVar1) {
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
      }
      else {
        Kumu::Result_t::operator()((int *)this,Kumu::RESULT_FALSE);
      }
    }
    else {
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FALSE);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVReader::ReadUi64(const MDDEntry& Entry, ui64_t* value)
{
  ASDCP_TEST_NULL(value);

  if ( FindTL(Entry) )
    return MemIOReader::ReadUi64BE(value) ? RESULT_OK : RESULT_FALSE(__LINE__, __FILE__);

  return RESULT_FALSE;
}